

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O3

bool __thiscall
bssl::spake2plus::Prover::ComputeConfirmation
          (Prover *this,Span<unsigned_char> out_confirm,Span<unsigned_char> out_secret,
          Span<const_unsigned_char> peer_share,Span<const_unsigned_char> peer_confirm)

{
  bool bVar1;
  int iVar2;
  EC_GROUP *group;
  size_t sVar3;
  Span<const_unsigned_char> in;
  uint8_t verifier_confirm [32];
  EC_JACOBIAN tmp;
  EC_JACOBIAN r;
  EC_AFFINE Y;
  EC_JACOBIAN t;
  EC_AFFINE V;
  EC_AFFINE Z;
  EC_JACOBIAN Y_j;
  EC_JACOBIAN N_j;
  
  sVar3 = out_secret.size_;
  if ((((sVar3 == 0x20 && out_confirm.size_ == 0x20) && this->state_ == kShareGenerated) &&
      (peer_share.size_ == 0x41)) && (peer_confirm.size_ == 0x20)) {
    group = EC_group_p256();
    iVar2 = ec_point_from_uncompressed(group,&Y,peer_share.data_,0x41);
    if (iVar2 == 0) {
      iVar2 = 0x14f;
    }
    else {
      in.size_ = sVar3;
      in.data_ = (uchar *)0x41;
      anon_unknown_0::ConstantToJacobian
                ((anon_unknown_0 *)group,(EC_GROUP *)&N_j,
                 (EC_JACOBIAN *)(anonymous_namespace)::kN_bytes,in);
      iVar2 = ec_point_mul_scalar(group,&r,&N_j,&this->w0_);
      if (iVar2 != 0) {
        ec_felem_neg(group,&r.Y,&r.Y);
        ec_affine_to_jacobian(group,&Y_j,&Y);
        (*group->meth->add)(group,&t,&Y_j,&r);
        iVar2 = ec_point_mul_scalar(group,&tmp,&t,&this->x_);
        if (iVar2 != 0) {
          iVar2 = ec_jacobian_to_affine(group,&Z,&tmp);
          if ((iVar2 != 0) && (iVar2 = ec_point_mul_scalar(group,&tmp,&t,&this->w1_), iVar2 != 0)) {
            iVar2 = ec_jacobian_to_affine(group,&V,&tmp);
            if ((iVar2 != 0) &&
               ((bVar1 = anon_unknown_0::ComputeTranscript
                                   (out_confirm.data_,verifier_confirm,out_secret.data_,this->share_
                                    ,peer_share.data_,&this->transcript_hash_,&Z,&V,&this->w0_),
                bVar1 && (iVar2 = CRYPTO_memcmp(verifier_confirm,peer_confirm.data_,0x20),
                         iVar2 == 0)))) {
              this->state_ = kDone;
              return true;
            }
          }
        }
        return false;
      }
      iVar2 = 0x158;
    }
  }
  else {
    iVar2 = 0x147;
  }
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,iVar2);
  return false;
}

Assistant:

bool Prover::ComputeConfirmation(Span<uint8_t> out_confirm,
                                 Span<uint8_t> out_secret,
                                 Span<const uint8_t> peer_share,
                                 Span<const uint8_t> peer_confirm) {
  if (state_ != State::kShareGenerated || out_confirm.size() != kConfirmSize ||
      out_secret.size() != kSecretSize || peer_share.size() != kShareSize ||
      peer_confirm.size() != kConfirmSize) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EC_GROUP *group = EC_group_p256();
  EC_AFFINE Y;
  if (!ec_point_from_uncompressed(group, &Y, peer_share.data(),
                                  peer_share.size())) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  EC_JACOBIAN N_j;
  ConstantToJacobian(group, &N_j, kN_bytes);

  EC_JACOBIAN r;
  if (!ec_point_mul_scalar(group, &r, &N_j, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  ec_felem_neg(group, &r.Y, &r.Y);

  EC_JACOBIAN Y_j;
  ec_affine_to_jacobian(group, &Y_j, &Y);

  EC_JACOBIAN t;
  group->meth->add(group, &t, &Y_j, &r);

  EC_JACOBIAN tmp;
  EC_AFFINE Z, V;
  // TODO(crbug.com/383778231): The two affine conversions could be batched
  // together.
  if (!ec_point_mul_scalar(group, &tmp, &t, &x_) ||   //
      !ec_jacobian_to_affine(group, &Z, &tmp) ||      //
      !ec_point_mul_scalar(group, &tmp, &t, &w1_) ||  //
      !ec_jacobian_to_affine(group, &V, &tmp)) {
    return 0;
  }

  uint8_t verifier_confirm[kConfirmSize];
  if (!ComputeTranscript(out_confirm.data(), verifier_confirm,
                         out_secret.data(), share_, peer_share.data(),
                         &transcript_hash_, &Z, &V, &w0_) ||
      CRYPTO_memcmp(verifier_confirm, peer_confirm.data(),
                    sizeof(verifier_confirm)) != 0) {
    return 0;
  }

  state_ = State::kDone;
  return true;
}